

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  PropertySpecSyntax *args_6;
  ActionBlockSyntax *args_8;
  ConcurrentAssertionStatementSyntax *pCVar1;
  NamedLabelSyntax *local_78;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = (NamedLabelSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_6 = (PropertySpecSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0x88),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  args_8 = (ActionBlockSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConcurrentAssertionStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertySpecSyntax&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_78,args_2,&local_70,
                      &local_40,&local_50,args_6,&local_60,args_8);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConcurrentAssertionStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConcurrentAssertionStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.propertyOrSequence.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<PropertySpecSyntax>(*node.propertySpec, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<ActionBlockSyntax>(*node.action, alloc)
    );
}